

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateRAIIHandleCommandDeclarations
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
          *handle,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *specialFunctions)

{
  _Rb_tree_color _Var1;
  pointer pNVar2;
  pointer pcVar3;
  _Base_ptr __n;
  _Rb_tree_color __val;
  string *psVar4;
  _Rep_type *p_Var5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  *ppVar6;
  pointer pbVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  pointer pFVar11;
  const_iterator cVar12;
  const_iterator cVar13;
  iterator iVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  pointer pRVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  ulong uVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *command;
  string *psVar20;
  string *psVar21;
  undefined8 uVar22;
  VulkanHppGenerator *pVVar23;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pEVar24;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *command_1;
  pointer pNVar25;
  bool condition;
  string handleProtect;
  string __str;
  string enter;
  string leave;
  string titleProtect;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  firstLevelCommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  secondLevelCommands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  secondLevelCommands_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  firstLevelCommands_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
  listedCommands;
  undefined1 local_250 [32];
  int local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
  local_228;
  string *local_1e0;
  pointer local_1d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [40];
  VulkanHppGenerator *local_120;
  pointer local_118;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110;
  undefined1 local_108 [40];
  pointer local_e0;
  pointer local_d8;
  _Base_ptr local_d0;
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  local_50 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  pFVar11 = (this->m_features).
            super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (this->m_features).
             super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_1e0 = __return_storage_ptr__;
  local_1d0 = handle;
  local_120 = this;
  local_110 = &specialFunctions->_M_t;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pFVar11 != local_48) {
    local_c0 = &(specialFunctions->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_c8 = (_Base_ptr)&(handle->second).commands;
    local_118 = (pointer)&(handle->second).commands._M_t._M_impl.super__Rb_tree_header;
    local_d0 = (_Base_ptr)&(handle->second).secondLevelCommands;
    local_d8 = (pointer)&(handle->second).secondLevelCommands._M_t._M_impl.super__Rb_tree_header;
    do {
      local_148._0_8_ = (string *)0x0;
      local_148._8_8_ = (string *)0x0;
      local_148._16_8_ = (pointer)0x0;
      local_108._16_8_ = (pointer)0x0;
      local_108._0_8_ = (string *)0x0;
      local_108._8_8_ = (string *)0x0;
      pRVar16 = (pFVar11->requireData).
                super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_40 = (pFVar11->requireData).
                 super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_1d8 = pFVar11;
      if (pRVar16 != local_40) {
        do {
          pNVar2 = (pRVar16->commands).
                   super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_38 = pRVar16;
          for (pNVar25 = (pRVar16->commands).
                         super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                         ._M_impl.super__Vector_impl_data._M_start; pNVar25 != pNVar2;
              pNVar25 = pNVar25 + 1) {
            cVar12 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(local_110,&pNVar25->name);
            if (cVar12._M_node == local_c0) {
              cVar12 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(local_c8,&pNVar25->name);
              if ((pointer)cVar12._M_node == local_118) {
                cVar12 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find(local_d0,&pNVar25->name);
                if ((pointer)cVar12._M_node != local_d8) {
                  iVar14 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
                           ::find(&local_80,&pNVar25->name);
                  if ((_Rb_tree_header *)iVar14._M_node == &local_80._M_impl.super__Rb_tree_header)
                  {
                    pcVar3 = (local_1d8->name)._M_dataplus._M_p;
                    local_250._0_8_ = (VulkanHppGenerator *)(local_250 + 0x10);
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)local_250,pcVar3,
                               pcVar3 + (local_1d8->name)._M_string_length);
                    local_230 = pNVar25->xmlLine;
                    std::
                    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
                    ::
                    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_true>
                              (&local_228,&pNVar25->name,(NameLine *)local_250);
                    std::
                    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                    ::
                    _M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>
                              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                                *)&local_80,&local_228);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_228.second.name._M_dataplus._M_p != &local_228.second.name.field_2)
                    {
                      operator_delete(local_228.second.name._M_dataplus._M_p,
                                      local_228.second.name.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
                      operator_delete(local_228.first._M_dataplus._M_p,
                                      local_228.first.field_2._M_allocated_capacity + 1);
                    }
                    if ((VulkanHppGenerator *)local_250._0_8_ !=
                        (VulkanHppGenerator *)(local_250 + 0x10)) {
                      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                    }
                    if ((local_1d0->first)._M_string_length == 0) {
                      __assert_fail("!handle.first.empty()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                                    ,0x2378,
                                    "std::string VulkanHppGenerator::generateRAIIHandleCommandDeclarations(const std::pair<std::string, HandleData> &, const std::set<std::string> &) const"
                                   );
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_108,&pNVar25->name);
                  }
                  else {
                    __n = iVar14._M_node[2]._M_parent;
                    if (__n == (_Base_ptr)(local_1d8->name)._M_string_length) {
                      if (__n == (_Base_ptr)0x0) {
                        condition = true;
                      }
                      else {
                        iVar9 = bcmp(*(void **)(iVar14._M_node + 2),
                                     (local_1d8->name)._M_dataplus._M_p,(size_t)__n);
                        condition = iVar9 == 0;
                      }
                    }
                    else {
                      condition = false;
                    }
                    iVar9 = pNVar25->xmlLine;
                    std::operator+(&local_188,"command <",&pNVar25->name);
                    pbVar15 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              append(&local_188,"> already listed as required for feature <");
                    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(pbVar15->_M_dataplus)._M_p;
                    paVar17 = &pbVar15->field_2;
                    if (paVar18 == paVar17) {
                      local_1a8.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
                      local_1a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar15->field_2 + 8);
                    }
                    else {
                      local_1a8.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
                      local_1a8._M_dataplus._M_p = (pointer)paVar18;
                    }
                    local_1a8._M_string_length = pbVar15->_M_string_length;
                    (pbVar15->_M_dataplus)._M_p = (pointer)paVar17;
                    pbVar15->_M_string_length = 0;
                    (pbVar15->field_2)._M_local_buf[0] = '\0';
                    pbVar15 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              _M_append(&local_1a8,*(char **)(iVar14._M_node + 2),
                                        (size_type)iVar14._M_node[2]._M_parent);
                    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(pbVar15->_M_dataplus)._M_p;
                    paVar17 = &pbVar15->field_2;
                    if (paVar18 == paVar17) {
                      local_168.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
                      local_168.field_2._8_8_ = *(undefined8 *)((long)&pbVar15->field_2 + 8);
                    }
                    else {
                      local_168.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
                      local_168._M_dataplus._M_p = (pointer)paVar18;
                    }
                    local_168._M_string_length = pbVar15->_M_string_length;
                    (pbVar15->_M_dataplus)._M_p = (pointer)paVar17;
                    pbVar15->_M_string_length = 0;
                    (pbVar15->field_2)._M_local_buf[0] = '\0';
                    pbVar15 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              append(&local_168,"> on line ");
                    local_250._0_8_ = local_250 + 0x10;
                    pVVar23 = (VulkanHppGenerator *)(pbVar15->_M_dataplus)._M_p;
                    paVar18 = &pbVar15->field_2;
                    local_e0 = (pointer)CONCAT44(local_e0._4_4_,iVar9);
                    if (pVVar23 == (VulkanHppGenerator *)paVar18) {
                      local_250._16_8_ = paVar18->_M_allocated_capacity;
                      local_250._24_8_ = *(undefined8 *)((long)&pbVar15->field_2 + 8);
                    }
                    else {
                      local_250._16_8_ = paVar18->_M_allocated_capacity;
                      local_250._0_8_ = pVVar23;
                    }
                    local_250._8_8_ = pbVar15->_M_string_length;
                    (pbVar15->_M_dataplus)._M_p = (pointer)paVar18;
                    pbVar15->_M_string_length = 0;
                    (pbVar15->field_2)._M_local_buf[0] = '\0';
                    _Var1 = iVar14._M_node[3]._M_color;
                    __val = -_Var1;
                    if (0 < (int)_Var1) {
                      __val = _Var1;
                    }
                    __len = 1;
                    if (9 < __val) {
                      uVar19 = (ulong)__val;
                      uVar8 = 4;
                      do {
                        __len = uVar8;
                        uVar10 = (uint)uVar19;
                        if (uVar10 < 100) {
                          __len = __len - 2;
                          goto LAB_00190855;
                        }
                        if (uVar10 < 1000) {
                          __len = __len - 1;
                          goto LAB_00190855;
                        }
                        if (uVar10 < 10000) goto LAB_00190855;
                        uVar19 = uVar19 / 10000;
                        uVar8 = __len + 4;
                      } while (99999 < uVar10);
                      __len = __len + 1;
                    }
LAB_00190855:
                    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_construct(&local_1c8,(ulong)(-((int)_Var1 >> 0x1f) + __len),'-');
                    std::__detail::__to_chars_10_impl<unsigned_int>
                              (local_1c8._M_dataplus._M_p + (uint)-((int)_Var1 >> 0x1f),__len,__val)
                    ;
                    this = local_120;
                    uVar19 = 0xf;
                    if ((VulkanHppGenerator *)local_250._0_8_ !=
                        (VulkanHppGenerator *)(local_250 + 0x10)) {
                      uVar19 = local_250._16_8_;
                    }
                    if (uVar19 < local_250._8_8_ + local_1c8._M_string_length) {
                      uVar22 = 0xf;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                        uVar22 = local_1c8.field_2._M_allocated_capacity;
                      }
                      if ((ulong)uVar22 < local_250._8_8_ + local_1c8._M_string_length)
                      goto LAB_001908fc;
                      pbVar15 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                replace(&local_1c8,0,0,(char *)local_250._0_8_,local_250._8_8_);
                    }
                    else {
LAB_001908fc:
                      pbVar15 = std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_250,local_1c8._M_dataplus._M_p,
                                          local_1c8._M_string_length);
                    }
                    local_228.first._M_dataplus._M_p = (pointer)&local_228.first.field_2;
                    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(pbVar15->_M_dataplus)._M_p;
                    paVar18 = &pbVar15->field_2;
                    if (paVar17 == paVar18) {
                      local_228.first.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity
                      ;
                      local_228.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar15->field_2 + 8);
                    }
                    else {
                      local_228.first.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity
                      ;
                      local_228.first._M_dataplus._M_p = (pointer)paVar17;
                    }
                    local_228.first._M_string_length = pbVar15->_M_string_length;
                    (pbVar15->_M_dataplus)._M_p = (pointer)paVar18;
                    pbVar15->_M_string_length = 0;
                    paVar18->_M_local_buf[0] = '\0';
                    checkForError(condition,(int)local_e0,&local_228.first);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
                      operator_delete(local_228.first._M_dataplus._M_p,
                                      local_228.first.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                      operator_delete(local_1c8._M_dataplus._M_p,
                                      local_1c8.field_2._M_allocated_capacity + 1);
                    }
                    if ((VulkanHppGenerator *)local_250._0_8_ !=
                        (VulkanHppGenerator *)(local_250 + 0x10)) {
                      operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_168._M_dataplus._M_p != &local_168.field_2) {
                      operator_delete(local_168._M_dataplus._M_p,
                                      local_168.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                      operator_delete(local_1a8._M_dataplus._M_p,
                                      local_1a8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_188._M_dataplus._M_p != &local_188.field_2) {
                      operator_delete(local_188._M_dataplus._M_p,
                                      CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                               local_188.field_2._M_local_buf[0]) + 1);
                    }
                  }
                }
              }
              else {
                cVar13 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
                         ::find(&local_80,&pNVar25->name);
                if ((_Rb_tree_header *)cVar13._M_node != &local_80._M_impl.super__Rb_tree_header) {
                  __assert_fail("!listedCommands.contains( command.name )",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                                ,0x236e,
                                "std::string VulkanHppGenerator::generateRAIIHandleCommandDeclarations(const std::pair<std::string, HandleData> &, const std::set<std::string> &) const"
                               );
                }
                pcVar3 = (local_1d8->name)._M_dataplus._M_p;
                local_250._0_8_ = (VulkanHppGenerator *)(local_250 + 0x10);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_250,pcVar3,pcVar3 + (local_1d8->name)._M_string_length);
                local_230 = pNVar25->xmlLine;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
                ::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_true>
                          (&local_228,&pNVar25->name,(NameLine *)local_250);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                ::
                _M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                            *)&local_80,&local_228);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228.second.name._M_dataplus._M_p != &local_228.second.name.field_2) {
                  operator_delete(local_228.second.name._M_dataplus._M_p,
                                  local_228.second.name.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
                  operator_delete(local_228.first._M_dataplus._M_p,
                                  local_228.first.field_2._M_allocated_capacity + 1);
                }
                if ((VulkanHppGenerator *)local_250._0_8_ !=
                    (VulkanHppGenerator *)(local_250 + 0x10)) {
                  operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_148,&pNVar25->name);
              }
            }
          }
          pRVar16 = local_38 + 1;
        } while (pRVar16 != local_40);
      }
      if ((local_148._0_8_ != local_148._8_8_) || (local_108._0_8_ != local_108._8_8_)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_250,"\n  //=== ",&local_1d8->name);
        pbVar15 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_250," ===\n");
        paVar18 = &local_228.first.field_2;
        local_228.first._M_dataplus._M_p = (pbVar15->_M_dataplus)._M_p;
        paVar17 = &pbVar15->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228.first._M_dataplus._M_p == paVar17) {
          local_228.first.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_228.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar15->field_2 + 8);
          local_228.first._M_dataplus._M_p = (pointer)paVar18;
        }
        else {
          local_228.first.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        }
        local_228.first._M_string_length = pbVar15->_M_string_length;
        (pbVar15->_M_dataplus)._M_p = (pointer)paVar17;
        pbVar15->_M_string_length = 0;
        (pbVar15->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (local_1e0,local_228.first._M_dataplus._M_p,local_228.first._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228.first._M_dataplus._M_p != paVar18) {
          operator_delete(local_228.first._M_dataplus._M_p,
                          local_228.first.field_2._M_allocated_capacity + 1);
        }
        psVar20 = (string *)local_148._0_8_;
        psVar4 = (string *)local_148._8_8_;
        if ((VulkanHppGenerator *)local_250._0_8_ != (VulkanHppGenerator *)(local_250 + 0x10)) {
          operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
          psVar20 = (string *)local_148._0_8_;
          psVar4 = (string *)local_148._8_8_;
        }
        for (; uVar22 = local_108._8_8_, psVar21 = (string *)local_108._0_8_, psVar20 != psVar4;
            psVar20 = psVar20 + 1) {
          generateRAIIHandleCommand
                    (&local_228.first,this,psVar20,(ulong)((local_1d0->first)._M_string_length != 0)
                     ,false);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (local_1e0,local_228.first._M_dataplus._M_p,local_228.first._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
            operator_delete(local_228.first._M_dataplus._M_p,
                            local_228.first.field_2._M_allocated_capacity + 1);
          }
        }
        for (; psVar21 != (string *)uVar22; psVar21 = psVar21 + 1) {
          if ((local_1d0->first)._M_string_length == 0) {
            __assert_fail("!handle.first.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x238f,
                          "std::string VulkanHppGenerator::generateRAIIHandleCommandDeclarations(const std::pair<std::string, HandleData> &, const std::set<std::string> &) const"
                         );
          }
          generateRAIIHandleCommand(&local_228.first,this,psVar21,2,false);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (local_1e0,local_228.first._M_dataplus._M_p,local_228.first._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
            operator_delete(local_228.first._M_dataplus._M_p,
                            local_228.first.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_108);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148);
      pFVar11 = local_1d8 + 1;
    } while (pFVar11 != local_48);
  }
  pEVar24 = (this->m_extensions).
            super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_e0 = (this->m_extensions).
             super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar24 != local_e0) {
    p_Var5 = (_Rep_type *)&local_110->_M_impl;
    local_c0 = (_Base_ptr)&(local_1d0->second).commands;
    local_c8 = &(local_1d0->second).commands._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1d8 = (pointer)&(local_1d0->second).secondLevelCommands;
    local_d0 = &(local_1d0->second).secondLevelCommands._M_t._M_impl.super__Rb_tree_header._M_header
    ;
    do {
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      pRVar16 = (pEVar24->requireData).
                super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_d8 = (pEVar24->requireData).
                 super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_118 = pEVar24;
      if (pRVar16 != local_d8) {
        do {
          pNVar2 = (pRVar16->commands).
                   super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pNVar25 = (pRVar16->commands).
                         super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                         ._M_impl.super__Vector_impl_data._M_start; pNVar25 != pNVar2;
              pNVar25 = pNVar25 + 1) {
            cVar12 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(local_110,&pNVar25->name);
            if (((_Rb_tree_header *)cVar12._M_node == &(p_Var5->_M_impl).super__Rb_tree_header) &&
               (cVar13 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
                         ::find(&local_80,&pNVar25->name),
               (_Rb_tree_header *)cVar13._M_node == &local_80._M_impl.super__Rb_tree_header)) {
              cVar12 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(local_c0,&pNVar25->name);
              if (cVar12._M_node == local_c8) {
                cVar12 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_1d8,&pNVar25->name);
                if (cVar12._M_node == local_d0) goto LAB_00190f1f;
                local_250._0_8_ = local_250 + 0x10;
                pcVar3 = (pEVar24->name)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_250,pcVar3,pcVar3 + (pEVar24->name)._M_string_length);
                local_230 = pNVar25->xmlLine;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
                ::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_true>
                          (&local_228,&pNVar25->name,(NameLine *)local_250);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                ::
                _M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                            *)&local_80,&local_228);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228.second.name._M_dataplus._M_p != &local_228.second.name.field_2) {
                  operator_delete(local_228.second.name._M_dataplus._M_p,
                                  local_228.second.name.field_2._M_allocated_capacity + 1);
                }
                pEVar24 = local_118;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
                  operator_delete(local_228.first._M_dataplus._M_p,
                                  local_228.first.field_2._M_allocated_capacity + 1);
                }
                if ((VulkanHppGenerator *)local_250._0_8_ !=
                    (VulkanHppGenerator *)(local_250 + 0x10)) {
                  operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                }
                this_00 = &local_b8;
              }
              else {
                local_250._0_8_ = local_250 + 0x10;
                pcVar3 = (pEVar24->name)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_250,pcVar3,pcVar3 + (pEVar24->name)._M_string_length);
                local_230 = pNVar25->xmlLine;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
                ::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_true>
                          (&local_228,&pNVar25->name,(NameLine *)local_250);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                ::
                _M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::NameLine>>>
                            *)&local_80,&local_228);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228.second.name._M_dataplus._M_p != &local_228.second.name.field_2) {
                  operator_delete(local_228.second.name._M_dataplus._M_p,
                                  local_228.second.name.field_2._M_allocated_capacity + 1);
                }
                pEVar24 = local_118;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
                  operator_delete(local_228.first._M_dataplus._M_p,
                                  local_228.first.field_2._M_allocated_capacity + 1);
                }
                if ((VulkanHppGenerator *)local_250._0_8_ !=
                    (VulkanHppGenerator *)(local_250 + 0x10)) {
                  operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
                }
                this_00 = &local_98;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(this_00,&pNVar25->name);
            }
LAB_00190f1f:
          }
          pRVar16 = pRVar16 + 1;
        } while (pRVar16 != local_d8);
      }
      pVVar23 = local_120;
      ppVar6 = local_1d0;
      if ((local_98.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_98.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         (local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        getProtectFromType((string *)local_250,local_120,&local_1d0->first);
        getProtectFromTitle(&local_168,pVVar23,&pEVar24->name);
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        local_1a8._M_string_length = 0;
        local_1a8.field_2._M_allocated_capacity =
             local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        local_188._M_string_length = 0;
        local_188.field_2._M_local_buf[0] = '\0';
        if ((local_168._M_string_length != 0) &&
           ((local_168._M_string_length != local_250._8_8_ ||
            (pVVar23 = (VulkanHppGenerator *)local_250._0_8_,
            iVar9 = bcmp(local_168._M_dataplus._M_p,(void *)local_250._0_8_,
                         local_168._M_string_length), iVar9 != 0)))) {
          generateProtection((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_228,pVVar23,&local_168,true);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_1a8,&local_228.first);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_188,&local_228.second.name);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228.second.name._M_dataplus._M_p != &local_228.second.name.field_2) {
            operator_delete(local_228.second.name._M_dataplus._M_p,
                            local_228.second.name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
            operator_delete(local_228.first._M_dataplus._M_p,
                            local_228.first.field_2._M_allocated_capacity + 1);
          }
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,"\n",&local_1a8);
        pbVar15 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,"  //=== ");
        local_148._0_8_ = (pbVar15->_M_dataplus)._M_p;
        paVar18 = &pbVar15->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._0_8_ == paVar18) {
          local_148._16_8_ = paVar18->_M_allocated_capacity;
          local_148._24_8_ = *(undefined8 *)((long)&pbVar15->field_2 + 8);
          local_148._0_8_ = (string *)(local_148 + 0x10);
        }
        else {
          local_148._16_8_ = paVar18->_M_allocated_capacity;
        }
        local_148._8_8_ = pbVar15->_M_string_length;
        (pbVar15->_M_dataplus)._M_p = (pointer)paVar18;
        pbVar15->_M_string_length = 0;
        (pbVar15->field_2)._M_local_buf[0] = '\0';
        pbVar15 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_148,(pEVar24->name)._M_dataplus._M_p,
                            (pEVar24->name)._M_string_length);
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar15->_M_dataplus)._M_p;
        paVar17 = &pbVar15->field_2;
        if (paVar18 == paVar17) {
          local_1c8.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_1c8.field_2._8_8_ = *(undefined8 *)((long)&pbVar15->field_2 + 8);
        }
        else {
          local_1c8.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_1c8._M_dataplus._M_p = (pointer)paVar18;
        }
        local_1c8._M_string_length = pbVar15->_M_string_length;
        (pbVar15->_M_dataplus)._M_p = (pointer)paVar17;
        pbVar15->_M_string_length = 0;
        (pbVar15->field_2)._M_local_buf[0] = '\0';
        pbVar15 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_1c8," ===\n");
        local_228.first._M_dataplus._M_p = (pointer)&local_228.first.field_2;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar15->_M_dataplus)._M_p;
        paVar17 = &pbVar15->field_2;
        if (paVar18 == paVar17) {
          local_228.first.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_228.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar15->field_2 + 8);
        }
        else {
          local_228.first.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
          local_228.first._M_dataplus._M_p = (pointer)paVar18;
        }
        local_228.first._M_string_length = pbVar15->_M_string_length;
        (pbVar15->_M_dataplus)._M_p = (pointer)paVar17;
        pbVar15->_M_string_length = 0;
        (pbVar15->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (local_1e0,local_228.first._M_dataplus._M_p,local_228.first._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
          operator_delete(local_228.first._M_dataplus._M_p,
                          local_228.first.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((string *)local_148._0_8_ != (string *)(local_148 + 0x10)) {
          operator_delete((void *)local_148._0_8_,(ulong)(local_148._16_8_ + 1));
        }
        psVar20 = local_98.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar4 = local_98.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((string *)local_108._0_8_ != (string *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
          psVar20 = local_98.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar4 = local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pbVar7 = local_b8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
            psVar21 = local_b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, psVar20 != psVar4;
            psVar20 = psVar20 + 1) {
          generateRAIIHandleCommand
                    (&local_228.first,local_120,psVar20,
                     (ulong)((ppVar6->first)._M_string_length != 0),false);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (local_1e0,local_228.first._M_dataplus._M_p,local_228.first._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
            operator_delete(local_228.first._M_dataplus._M_p,
                            local_228.first.field_2._M_allocated_capacity + 1);
          }
        }
        for (; psVar21 != pbVar7; psVar21 = psVar21 + 1) {
          if ((ppVar6->first)._M_string_length == 0) {
            __assert_fail("!handle.first.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x23bb,
                          "std::string VulkanHppGenerator::generateRAIIHandleCommandDeclarations(const std::pair<std::string, HandleData> &, const std::set<std::string> &) const"
                         );
          }
          generateRAIIHandleCommand(&local_228.first,local_120,psVar21,2,false);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (local_1e0,local_228.first._M_dataplus._M_p,local_228.first._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228.first._M_dataplus._M_p != &local_228.first.field_2) {
            operator_delete(local_228.first._M_dataplus._M_p,
                            local_228.first.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (local_1e0,local_188._M_dataplus._M_p,local_188._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,
                          CONCAT71(local_188.field_2._M_allocated_capacity._1_7_,
                                   local_188.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if ((VulkanHppGenerator *)local_250._0_8_ != (VulkanHppGenerator *)(local_250 + 0x10)) {
          operator_delete((void *)local_250._0_8_,local_250._16_8_ + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      pEVar24 = pEVar24 + 1;
    } while (pEVar24 != local_e0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
  ::~_Rb_tree(&local_80);
  return local_1e0;
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleCommandDeclarations( std::pair<std::string, HandleData> const & handle,
                                                                       std::set<std::string> const &              specialFunctions ) const
{
  std::string                     functionDeclarations;
  std::map<std::string, NameLine> listedCommands;  // some commands are listed with more than one extension !
  for ( auto const & feature : m_features )
  {
    std::vector<std::string> firstLevelCommands, secondLevelCommands;

    for ( auto const & require : feature.requireData )
    {
      for ( auto const & command : require.commands )
      {
        if ( !specialFunctions.contains( command.name ) )
        {
          if ( handle.second.commands.contains( command.name ) )
          {
            assert( !listedCommands.contains( command.name ) );
            listedCommands.insert( { command.name, { feature.name, command.xmlLine } } );
            firstLevelCommands.push_back( command.name );
          }
          else if ( handle.second.secondLevelCommands.contains( command.name ) )
          {
            auto listedIt = listedCommands.find( command.name );
            if ( listedIt == listedCommands.end() )
            {
              listedCommands.insert( { command.name, { feature.name, command.xmlLine } } );
              assert( !handle.first.empty() );
              secondLevelCommands.push_back( command.name );
            }
            else
            {
              checkForError( listedIt->second.name == feature.name,
                             command.xmlLine,
                             "command <" + command.name + "> already listed as required for feature <" + listedIt->second.name + "> on line " +
                               std::to_string( listedIt->second.xmlLine ) );
            }
          }
        }
      }
    }
    if ( !firstLevelCommands.empty() || !secondLevelCommands.empty() )
    {
      functionDeclarations += "\n  //=== " + feature.name + " ===\n";
      for ( auto const & command : firstLevelCommands )
      {
        functionDeclarations += generateRAIIHandleCommand( command, handle.first.empty() ? 0 : 1, false );
      }
      for ( auto const & command : secondLevelCommands )
      {
        assert( !handle.first.empty() );
        functionDeclarations += generateRAIIHandleCommand( command, 2, false );
      }
    }
  }

  for ( auto const & extension : m_extensions )
  {
    std::vector<std::string> firstLevelCommands, secondLevelCommands;
    for ( auto & req : extension.requireData )
    {
      for ( auto const & command : req.commands )
      {
        if ( !specialFunctions.contains( command.name ) && !listedCommands.contains( command.name ) )
        {
          if ( handle.second.commands.contains( command.name ) )
          {
            listedCommands.insert( { command.name, { extension.name, command.xmlLine } } );
            firstLevelCommands.push_back( command.name );
          }
          else if ( handle.second.secondLevelCommands.contains( command.name ) )
          {
            listedCommands.insert( { command.name, { extension.name, command.xmlLine } } );
            secondLevelCommands.push_back( command.name );
          }
        }
      }
    }
    if ( !firstLevelCommands.empty() || !secondLevelCommands.empty() )
    {
      std::string handleProtect = getProtectFromType( handle.first );
      std::string titleProtect  = getProtectFromTitle( extension.name );
      std::string enter, leave;
      if ( !titleProtect.empty() && ( titleProtect != handleProtect ) )
      {
        std::tie( enter, leave ) = generateProtection( titleProtect );
      }
      functionDeclarations += "\n" + enter + "  //=== " + extension.name + " ===\n";
      for ( auto const & command : firstLevelCommands )
      {
        functionDeclarations += generateRAIIHandleCommand( command, handle.first.empty() ? 0 : 1, false );
      }
      for ( auto const & command : secondLevelCommands )
      {
        assert( !handle.first.empty() );
        functionDeclarations += generateRAIIHandleCommand( command, 2, false );
      }
      functionDeclarations += leave;
    }
  }
  return functionDeclarations;
}